

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::PrintBackgroundCollectionStats(Recycler *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData);
  if ((this->collectionStats).backgroundMarkData[1].markCount != 0) {
    sVar1 = (this->collectionStats).backgroundMarkData[0].rescanObjectCount;
    sVar2 = (this->collectionStats).backgroundMarkData[0].rescanObjectByteCount;
    sVar3 = (this->collectionStats).backgroundMarkData[0].rescanLargePageCount;
    sVar4 = (this->collectionStats).backgroundMarkData[0].rescanLargeObjectCount;
    sVar5 = (this->collectionStats).backgroundMarkData[0].rescanLargeByteCount;
    sVar6 = (this->collectionStats).backgroundMarkData[1].rescanObjectCount;
    (this->collectionStats).backgroundMarkData[1].rescanPageCount =
         (this->collectionStats).backgroundMarkData[1].rescanPageCount -
         (this->collectionStats).backgroundMarkData[0].rescanPageCount;
    (this->collectionStats).backgroundMarkData[1].rescanObjectCount = sVar6 - sVar1;
    sVar1 = (this->collectionStats).backgroundMarkData[1].rescanLargePageCount;
    (this->collectionStats).backgroundMarkData[1].rescanObjectByteCount =
         (this->collectionStats).backgroundMarkData[1].rescanObjectByteCount - sVar2;
    (this->collectionStats).backgroundMarkData[1].rescanLargePageCount = sVar1 - sVar3;
    sVar1 = (this->collectionStats).backgroundMarkData[1].rescanLargeByteCount;
    (this->collectionStats).backgroundMarkData[1].rescanLargeObjectCount =
         (this->collectionStats).backgroundMarkData[1].rescanLargeObjectCount - sVar4;
    (this->collectionStats).backgroundMarkData[1].rescanLargeByteCount = sVar1 - sVar5;
    PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData + 1);
    return;
  }
  return;
}

Assistant:

void
Recycler::PrintBackgroundCollectionStats()
{
#if ENABLE_CONCURRENT_GC
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n"),
        _u("Pages"), _u("Count"), _u("Bytes"), _u("Pages"), _u("Count"), _u("Bytes"), _u("Count"), _u("%"), _u("NonLeafBytes   %"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));

    this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[0]);
    for (uint repeatCount = 1; repeatCount < RecyclerHeuristic::MaxBackgroundRepeatMarkCount; repeatCount++)
    {
        if (collectionStats.backgroundMarkData[repeatCount].markCount == 0)
        {
            break;
        }
        collectionStats.backgroundMarkData[repeatCount].rescanPageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanPageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectByteCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargePageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargePageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeByteCount;
        this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[repeatCount]);
    }
#endif
}